

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_0::AsyncifyLocals::doWalkFunction(AsyncifyLocals *this,Function *func)

{
  vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *currp;
  HeapType *this_00;
  ExpressionList *pEVar1;
  map<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_unsigned_long,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  *pmVar2;
  size_t *psVar3;
  set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *psVar4;
  pointer ppBVar5;
  undefined8 *puVar6;
  _Hash_node_base *p_Var7;
  __hash_code __code_00;
  Type *pTVar8;
  vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  pointer puVar9;
  Builder BVar10;
  AsyncifyBuilder *pAVar11;
  Function *pFVar12;
  uintptr_t uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Expression **currp_00;
  char *pcVar16;
  pointer puVar17;
  size_type sVar18;
  undefined8 uVar19;
  AsyncifyLocals *pAVar20;
  int iVar21;
  Index IVar22;
  Index IVar23;
  uint uVar24;
  uint uVar25;
  mapped_type *pmVar26;
  size_t sVar27;
  Type *pTVar28;
  _Hash_node_base *p_Var29;
  _Hash_node_base *p_Var30;
  _Hash_node_base *p_Var31;
  _Hash_node_base *p_Var32;
  Type *pTVar33;
  __node_ptr __node;
  pointer puVar34;
  AsyncifyBuilder *pAVar35;
  Expression *pEVar36;
  Type this_02;
  Block *pBVar37;
  Expression *pEVar38;
  LocalSet *pLVar39;
  pointer pLVar40;
  value_type pBVar41;
  TupleMake *value;
  LocalSet *item;
  key_type this_03;
  Block *this_04;
  Store *pSVar42;
  _Base_ptr p_Var43;
  TupleExtract *pTVar44;
  TupleExtract *this_05;
  Type TVar45;
  __hash_code __code;
  long lVar46;
  _Base_ptr p_Var47;
  _Rb_tree_header *p_Var48;
  _Rb_tree_header *p_Var49;
  char *pcVar50;
  _Base_ptr p_Var51;
  Expression **extraout_RDX;
  Expression **extraout_RDX_00;
  ulong uVar52;
  size_t sVar53;
  SetOfLocals *__bkt;
  SetOfLocals *live;
  SetOfLocals *extraout_RDX_01;
  SetOfLocals *live_00;
  set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  *psVar54;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  BasicBlock *this_06;
  _Rb_tree_color index;
  _Link_type __x;
  code *self;
  pointer pTVar55;
  Store *pSVar56;
  _Hash_node_base *p_Var57;
  MixedArena *pMVar58;
  Type in_R8;
  BasicBlock *pBVar59;
  _Hash_node_base *p_Var60;
  long lVar61;
  pointer __ptr_4;
  AsyncifyLocals *pAVar62;
  pointer ppBVar63;
  ulong uVar64;
  _Hash_node_base *p_Var65;
  undefined8 *puVar66;
  long *plVar67;
  bool bVar68;
  Signature SVar69;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  optional<wasm::Type> type__02;
  optional<wasm::Type> type__03;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  undefined1 auStack_498 [8];
  RelevantLiveLocalsWalker walker;
  Expression *local_140;
  Type TStack_138;
  BasicBlock *curr;
  pointer local_128;
  Name *local_120;
  Type *local_118;
  Store *local_110;
  Store *local_108;
  Function *local_100;
  undefined1 local_f8 [16];
  pointer local_e8;
  undefined1 auStack_d8 [8];
  unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
  queue;
  pointer local_88;
  undefined1 local_70 [8];
  Iterator __begin3;
  size_type local_50;
  Type TStack_40;
  AsyncifyLocals *local_38;
  
  auStack_498 = (undefined1  [8])func;
  local_100 = func;
  pmVar26 = std::
            map<wasm::Function_*,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::(anonymous_namespace)::ModuleAnalyzer::Info>_>_>
            ::operator[](&this->analyzer->map,(key_type *)auStack_498);
  if ((pmVar26->canChangeState == true) && ((pmVar26->isTopMostRuntime & 1U) == 0)) {
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         &walker.
          super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
          .
          super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
          .branches;
    auStack_498 = (undefined1  [8])0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.replacep
         = (Expression **)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .branches._M_t._M_impl._0_8_ =
         (ulong)(uint)walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                      .branches._M_t._M_impl._4_4_ << 0x20;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    fixed._M_elems[9].currp = (Expression **)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    currFunction = (Function *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    currModule = (Module *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .entry = (BasicBlock *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .exit = (BasicBlock *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .loopTops.
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .loopTops.
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pmVar2 = &walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .debugIds;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl._0_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         walker.
         super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
         .
         super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
         .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    memset(&walker.
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0,0xb2);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    _560_8_ = &walker.
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               .liveBlocks._M_h._M_rehash_policy._M_next_resize;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_buckets = (__buckets_ptr)0x1;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_bucket_count = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_element_count =
         CONCAT44(walker.
                  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  .liveBlocks._M_h._M_element_count._4_4_,0x3f800000);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)&walker.
                   super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .copies.sparseStorage._M_h._M_rehash_policy._M_next_resize;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_rehash_policy._4_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_rehash_policy._M_next_resize = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_buckets = (__buckets_ptr)0x1;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_bucket_count = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_element_count._0_4_ = 0x3f800000;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_rehash_policy._4_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_rehash_policy._M_next_resize = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.sparseStorage._M_h._M_single_bucket._0_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies.N = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    copies._84_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    totalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    totalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&walker.relevantBasicBlocks;
    walker.relevantBasicBlocks._M_t._M_impl._0_4_ = 0;
    walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    currFunction = (Function *)
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                   ).
                   super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                   .
                   super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                   .currModule;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_100;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar2;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar2;
    walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    sVar27 = Function::getNumLocals(local_100);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = (uint)sVar27;
    sparse_square_matrix<unsigned_char>::recreate
              ((sparse_square_matrix<unsigned_char> *)
               &walker.
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .liveBlocks._M_h._M_single_bucket,
               (uint)walker.
                     super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                     .
                     super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                     .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .totalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer)walker.
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .copies._80_8_) {
      walker.
      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
      .totalCopies.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)walker.
                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .copies._80_8_;
    }
    __x = (_Link_type)
          (ulong)(uint)walker.
                       super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .
                       super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                       .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &walker.
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .copies.N,(size_type)__x);
    puVar17 = walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .basicBlocks.
              super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar59 = walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .exit;
    this_06 = walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .exit;
    if ((BasicBlock *)
        walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .basicBlocks.
        super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .exit) {
      do {
        std::
        unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
        ::~unique_ptr((unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
                       *)this_06);
        this_06 = (BasicBlock *)
                  &(this_06->contents).start.
                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (this_06 != (BasicBlock *)puVar17);
      walker.
      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
      .
      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
      .basicBlocks.
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar59;
    }
    std::
    _Rb_tree<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
    ::_M_erase((_Rb_tree<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
                *)walker.
                  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  .
                  super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                  .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .entry = (BasicBlock *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = '\0';
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar2;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .debugIds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar2;
    CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    ::startBasicBlock((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                       *)auStack_498);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    currModule = (Module *)
                 walker.
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .loopTops.
                 super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (((long)walker.
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               .
               super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               .
               super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               .
               super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)walker.
               super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               .
               super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               .
               super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               .
               super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
               .stack.fixed._M_elems[9].currp >> 4) +
        (long)walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .
              super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .replacep != 0) {
      __assert_fail("stack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,0x12d,
                    "void wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::walk(Expression *&) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                   );
    }
    currp = (vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
             *)&local_100->body;
    self = CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
           ::scan;
    Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::pushTask
              ((Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_> *)
               auStack_498,
               CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
               ::scan,(Expression **)currp);
    lVar46 = ((long)walker.
                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .
                    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                    .
                    super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .
                    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .stack.flexible.
                    super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)walker.
                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .
                    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                    .
                    super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .
                    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .stack.fixed._M_elems[9].currp >> 4) +
             (long)walker.
                   super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                   .
                   super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .replacep;
    currp_00 = extraout_RDX;
    while (lVar46 != 0) {
      if ((pointer)walker.
                   super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                   .
                   super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          walker.
          super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
          .
          super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
          .
          super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
          .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
          stack.flexible.
          super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .
            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
            replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::Task, 10>::back() [T = wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::Task, N = 10]"
                       );
        }
        pTVar55 = (pointer)&walker.
                            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .
                            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                            .
                            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .
                            super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .stack.fixed._M_elems
                            [(long)walker.
                                   super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                   .
                                   super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                                   .
                                   super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                   .
                                   super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                   .replacep + -2].currp;
      }
      else {
        pTVar55 = walker.
                  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  .
                  super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                  .
                  super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  .
                  super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  .stack.flexible.
                  super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
                  ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      self = (code *)pTVar55->currp;
      if ((pointer)walker.
                   super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                   .
                   super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .stack.fixed._M_elems[9].currp ==
          walker.
          super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
          .
          super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
          .
          super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
          .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
          stack.flexible.
          super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (walker.
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .
            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
            replacep == (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x75,
                        "void wasm::SmallVector<wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::Task, 10>::pop_back() [T = wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::Task, N = 10]"
                       );
        }
        walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
        super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
        replacep = (Expression **)
                   ((long)walker.
                          super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                          .
                          super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                          .
                          super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                          .
                          super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                          .replacep + -1);
      }
      else {
        walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
        super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack
        .flexible.
        super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             walker.
             super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             .
             super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
             .
             super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_498 = (undefined1  [8])self;
      if ((Expression *)
          (((RelevantLiveLocalsWalker *)self)->
          super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
          ).
          super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
          .
          super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
          .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
          replacep == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,
                      "void wasm::Walker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::walk(Expression *&) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                     );
      }
      (*pTVar55->func)((RelevantLiveLocalsWalker *)auStack_498,(Expression **)self);
      currp_00 = extraout_RDX_00;
      lVar46 = ((long)walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                      .
                      super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                      .
                      super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .stack.fixed._M_elems[9].currp >> 4) +
               (long)walker.
                     super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                     .
                     super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                     .
                     super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                     .
                     super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                     .replacep;
    }
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .loopTops.
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
      ::doEndReturn((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                     *)auStack_498,(RelevantLiveLocalsWalker *)self,currp_00);
    }
    if ((char)walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
      auStack_d8 = (undefined1  [8])
                   walker.
                   super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                   .entry;
      std::
      vector<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ::push_back((vector<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                   *)&walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                      .exit,(value_type *)auStack_d8);
      std::
      unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
      ::~unique_ptr((unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>
                     *)auStack_d8);
    }
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
      __assert_fail("branches.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x255,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .ifLastBlockStack.
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)walker.
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .branches._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      __assert_fail("ifLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x256,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .loopLastBlockStack.
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .ifLastBlockStack.
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __assert_fail("loopLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,599,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .tryLastBlockStack.
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .loopLastBlockStack.
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __assert_fail("tryLastBlockStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,600,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .throwingInstsStack.
        super__Vector_base<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)walker.
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .tryLastBlockStack.
                 super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __assert_fail("throwingInstsStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x259,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if ((pointer)walker.
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .tryStack.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start !=
        walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .throwingInstsStack.
        super__Vector_base<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __assert_fail("tryStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x25a,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .processCatchStack.
        super__Vector_base<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)walker.
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .tryStack.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage) {
      __assert_fail("processCatchStack.size() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                    ,0x25b,
                    "void wasm::CFGWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>, wasm::Liveness>::doWalkFunction(Function *) [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>, Contents = wasm::Liveness]"
                   );
    }
    local_70 = (undefined1  [8])&TStack_40;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x1;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    local_50 = CONCAT44(local_50._4_4_,0x3f800000);
    TStack_40.id = 0;
    auStack_d8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
    queue._M_h._M_buckets = (__buckets_ptr)0x1;
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    queue._M_h._M_element_count._0_4_ = 0x3f800000;
    queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    queue._M_h._M_rehash_policy._4_4_ = 0;
    queue._M_h._M_rehash_policy._M_next_resize = 0;
    local_38 = this;
    std::
    unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
              *)auStack_d8,
             (value_type *)
             &walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .
              super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .currModule);
    puVar66 = (undefined8 *)queue._M_h._M_bucket_count;
    if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      do {
        pBVar41 = *(value_type *)(queue._M_h._M_bucket_count + 8);
        TStack_138.id = (uintptr_t)pBVar41;
        std::
        unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::erase((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 *)auStack_d8,(iterator)queue._M_h._M_bucket_count);
        std::
        unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  *)local_70,(value_type *)&stack0xfffffffffffffec8);
        ppBVar5 = (pBVar41->out).
                  super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar63 = (pBVar41->out).
                        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppBVar63 != ppBVar5;
            ppBVar63 = ppBVar63 + 1) {
          local_f8._0_8_ = *ppBVar63;
          p_Var65 = (_Hash_node_base *)
                    ((Type *)((long)local_70 +
                             ((ulong)local_f8._0_8_ %
                             (ulong)__begin3.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .parent) * 8))->id;
          p_Var29 = (_Hash_node_base *)0x0;
          if ((p_Var65 != (_Hash_node_base *)0x0) &&
             (p_Var29 = p_Var65, p_Var32 = p_Var65->_M_nxt,
             (value_type)local_f8._0_8_ != (value_type)p_Var65->_M_nxt[1]._M_nxt)) {
            while (p_Var65 = p_Var32->_M_nxt, p_Var65 != (_Hash_node_base *)0x0) {
              p_Var29 = (_Hash_node_base *)0x0;
              if (((ulong)p_Var65[1]._M_nxt %
                   (ulong)__begin3.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                   != (ulong)local_f8._0_8_ %
                      (ulong)__begin3.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent) ||
                 (p_Var29 = p_Var32, p_Var32 = p_Var65,
                 (value_type)local_f8._0_8_ == (value_type)p_Var65[1]._M_nxt)) goto LAB_007c4b9f;
            }
            p_Var29 = (_Hash_node_base *)0x0;
          }
LAB_007c4b9f:
          in_R8.id = (uintptr_t)
                     __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
          if ((p_Var29 == (_Hash_node_base *)0x0) || (p_Var29->_M_nxt == (_Hash_node_base *)0x0)) {
            std::
            unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                      *)auStack_d8,(value_type *)local_f8);
          }
        }
        puVar66 = (undefined8 *)queue._M_h._M_bucket_count;
      } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
    }
    while (puVar66 != (undefined8 *)0x0) {
      puVar6 = (undefined8 *)*puVar66;
      operator_delete(puVar66,0x10);
      puVar66 = puVar6;
    }
    memset((void *)auStack_d8,0,(long)queue._M_h._M_buckets << 3);
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    psVar3 = &walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .liveBlocks._M_h._M_rehash_policy._M_next_resize;
    if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != auStack_d8) {
      operator_delete((void *)auStack_d8,(long)queue._M_h._M_buckets << 3);
    }
    pTVar28 = &TStack_40;
    puVar66 = (undefined8 *)
              walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .liveBlocks._M_h._M_bucket_count;
    while (puVar66 != (undefined8 *)0x0) {
      puVar6 = (undefined8 *)*puVar66;
      operator_delete(puVar66,0x10);
      puVar66 = puVar6;
    }
    if (psVar3 != (size_t *)
                  walker.
                  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  ._560_8_) {
      operator_delete((void *)walker.
                              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                              ._560_8_,
                      (long)walker.
                            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .liveBlocks._M_h._M_buckets << 3);
    }
    pTVar33 = __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_element_count = local_50;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_rehash_policy._4_4_ = 0;
    if ((undefined1  [8])pTVar28 == local_70) {
      walker.
      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
      .liveBlocks._M_h._M_rehash_policy._M_next_resize = TStack_40.id;
      walker.
      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
      ._560_8_ = psVar3;
    }
    else {
      walker.
      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
      ._560_8_ = local_70;
    }
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_buckets =
         (__buckets_ptr)
         __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_bucket_count =
         __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    liveBlocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
      *(size_type **)
       (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        ._560_8_ +
       (*(ulong *)(__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index + 8) %
       (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent) *
       8) = &walker.
             super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             .liveBlocks._M_h._M_bucket_count;
    }
    local_70 = (undefined1  [8])0x0;
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    TStack_40.id = 0;
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
        (Type *)0x1) {
      TStack_40.id = 0;
    }
    else {
      pTVar28 = (Type *)__gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                  ((new_allocator<std::__detail::_Hash_node_base_*> *)auStack_d8,
                                   (size_type)
                                   __begin3.
                                   super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                   .parent,(void *)0x0);
      memset(pTVar28,0,(long)pTVar33 << 3);
    }
    sVar18 = walker.
             super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
             .liveBlocks._M_h._M_bucket_count;
    local_70 = (undefined1  [8])pTVar28;
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .liveBlocks._M_h._M_bucket_count != 0) {
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)operator_new(0x10);
      ((_Hash_node_base *)
      __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)->_M_nxt =
           (_Hash_node_base *)0x0;
      p_Var65 = *(_Hash_node_base **)(sVar18 + 8);
      ((_Hash_node_base *)
      (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 8))->
      _M_nxt = p_Var65;
      ((Type *)((long)local_70 +
               ((ulong)p_Var65 %
               (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      parent) * 8))->id =
           (uintptr_t)
           &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      p_Var65 = (_Hash_node_base *)
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
      for (puVar66 = *(undefined8 **)sVar18; puVar66 != (undefined8 *)0x0;
          puVar66 = (undefined8 *)*puVar66) {
        p_Var29 = (_Hash_node_base *)operator_new(0x10);
        p_Var29->_M_nxt = (_Hash_node_base *)0x0;
        p_Var29[1]._M_nxt = (_Hash_node_base *)puVar66[1];
        p_Var65->_M_nxt = p_Var29;
        uVar52 = (ulong)p_Var29[1]._M_nxt %
                 (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .parent;
        if ((_Hash_node_base *)((Type *)((long)local_70 + uVar52 * 8))->id == (_Hash_node_base *)0x0
           ) {
          ((Type *)((long)local_70 + uVar52 * 8))->id = (uintptr_t)p_Var65;
        }
        p_Var65 = p_Var29;
      }
    }
    local_120 = (Name *)walker.
                        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                        .
                        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                        .basicBlocks.
                        super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
    pBVar59 = walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .exit;
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .exit != (BasicBlock *)
                 walker.
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 .
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .basicBlocks.
                 super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
      do {
        p_Var65 = (_Hash_node_base *)
                  (pBVar59->contents).start.
                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        p_Var29 = (_Hash_node_base *)
                  ((Type *)((long)local_70 +
                           ((ulong)p_Var65 %
                           (ulong)__begin3.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                  .parent) * 8))->id;
        p_Var32 = (_Hash_node_base *)0x0;
        if ((p_Var29 != (_Hash_node_base *)0x0) &&
           (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt)) {
          while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
            p_Var32 = (_Hash_node_base *)0x0;
            if (((ulong)p_Var29[1]._M_nxt %
                 (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .parent !=
                 (ulong)p_Var65 %
                 (ulong)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .parent) ||
               (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
            goto LAB_007c4e5a;
          }
          p_Var32 = (_Hash_node_base *)0x0;
        }
LAB_007c4e5a:
        if ((p_Var32 == (_Hash_node_base *)0x0) || (p_Var32->_M_nxt == (_Hash_node_base *)0x0)) {
          if (p_Var65[0xd]._M_nxt != p_Var65[0xc]._M_nxt) {
            p_Var65[0xd]._M_nxt = p_Var65[0xc]._M_nxt;
          }
          lVar46 = (long)(pBVar59->contents).start.
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          in_R8.id = (uintptr_t)
                     __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
          if (*(long *)(lVar46 + 0x50) != *(long *)(lVar46 + 0x48)) {
            *(long *)(lVar46 + 0x50) = *(long *)(lVar46 + 0x48);
          }
        }
        else {
          p_Var29 = p_Var65[0xc]._M_nxt;
          p_Var32 = p_Var65[0xd]._M_nxt;
          lVar46 = (long)p_Var32 - (long)p_Var29 >> 5;
          p_Var57 = p_Var29;
          if (0 < lVar46) {
            p_Var57 = (_Hash_node_base *)
                      ((long)&p_Var29->_M_nxt +
                      ((long)p_Var32 - (long)p_Var29 & 0xffffffffffffffe0U));
            do {
              p_Var7 = p_Var29->_M_nxt;
              p_Var31 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var7 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var30 = (_Hash_node_base *)0x0;
              if ((p_Var31 != (_Hash_node_base *)0x0) &&
                 (p_Var30 = p_Var31, p_Var60 = p_Var31->_M_nxt, p_Var7 != p_Var31->_M_nxt[1]._M_nxt)
                 ) {
                while (p_Var31 = p_Var60->_M_nxt, p_Var31 != (_Hash_node_base *)0x0) {
                  p_Var30 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var31[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var7 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var30 = p_Var60, p_Var60 = p_Var31, p_Var7 == p_Var31[1]._M_nxt))
                  goto LAB_007c4eec;
                }
                p_Var30 = (_Hash_node_base *)0x0;
              }
LAB_007c4eec:
              if ((p_Var30 == (_Hash_node_base *)0x0) || (p_Var30->_M_nxt == (_Hash_node_base *)0x0)
                 ) goto LAB_007c51f8;
              p_Var7 = p_Var29[1]._M_nxt;
              p_Var31 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var7 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var30 = (_Hash_node_base *)0x0;
              if ((p_Var31 != (_Hash_node_base *)0x0) &&
                 (p_Var30 = p_Var31, p_Var60 = p_Var31->_M_nxt, p_Var7 != p_Var31->_M_nxt[1]._M_nxt)
                 ) {
                while (p_Var31 = p_Var60->_M_nxt, p_Var31 != (_Hash_node_base *)0x0) {
                  p_Var30 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var31[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var7 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var30 = p_Var60, p_Var60 = p_Var31, p_Var7 == p_Var31[1]._M_nxt))
                  goto LAB_007c4f56;
                }
                p_Var30 = (_Hash_node_base *)0x0;
              }
LAB_007c4f56:
              if ((p_Var30 == (_Hash_node_base *)0x0) || (p_Var30->_M_nxt == (_Hash_node_base *)0x0)
                 ) {
                p_Var29 = p_Var29 + 1;
                goto LAB_007c51f8;
              }
              p_Var7 = p_Var29[2]._M_nxt;
              p_Var31 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var7 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var30 = (_Hash_node_base *)0x0;
              if ((p_Var31 != (_Hash_node_base *)0x0) &&
                 (p_Var30 = p_Var31, p_Var60 = p_Var31->_M_nxt, p_Var7 != p_Var31->_M_nxt[1]._M_nxt)
                 ) {
                while (p_Var31 = p_Var60->_M_nxt, p_Var31 != (_Hash_node_base *)0x0) {
                  p_Var30 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var31[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var7 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var30 = p_Var60, p_Var60 = p_Var31, p_Var7 == p_Var31[1]._M_nxt))
                  goto LAB_007c4fc0;
                }
                p_Var30 = (_Hash_node_base *)0x0;
              }
LAB_007c4fc0:
              if ((p_Var30 == (_Hash_node_base *)0x0) || (p_Var30->_M_nxt == (_Hash_node_base *)0x0)
                 ) {
                p_Var29 = p_Var29 + 2;
                goto LAB_007c51f8;
              }
              p_Var7 = p_Var29[3]._M_nxt;
              p_Var31 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var7 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var30 = (_Hash_node_base *)0x0;
              if ((p_Var31 != (_Hash_node_base *)0x0) &&
                 (p_Var30 = p_Var31, p_Var60 = p_Var31->_M_nxt, p_Var7 != p_Var31->_M_nxt[1]._M_nxt)
                 ) {
                while (p_Var31 = p_Var60->_M_nxt, p_Var31 != (_Hash_node_base *)0x0) {
                  p_Var30 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var31[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var7 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var30 = p_Var60, p_Var60 = p_Var31, p_Var7 == p_Var31[1]._M_nxt))
                  goto LAB_007c502a;
                }
                p_Var30 = (_Hash_node_base *)0x0;
              }
LAB_007c502a:
              if ((p_Var30 == (_Hash_node_base *)0x0) || (p_Var30->_M_nxt == (_Hash_node_base *)0x0)
                 ) {
                p_Var29 = p_Var29 + 3;
                goto LAB_007c51f8;
              }
              p_Var29 = p_Var29 + 4;
              bVar68 = 1 < lVar46;
              lVar46 = lVar46 + -1;
            } while (bVar68);
          }
          lVar46 = (long)p_Var32 - (long)p_Var57 >> 3;
          if (lVar46 == 1) {
LAB_007c5193:
            p_Var29 = p_Var57->_M_nxt;
            p_Var7 = (_Hash_node_base *)
                     ((Type *)((long)local_70 +
                              ((ulong)p_Var29 %
                              (ulong)__begin3.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .parent) * 8))->id;
            p_Var31 = (_Hash_node_base *)0x0;
            if ((p_Var7 != (_Hash_node_base *)0x0) &&
               (p_Var31 = p_Var7, p_Var30 = p_Var7->_M_nxt, p_Var29 != p_Var7->_M_nxt[1]._M_nxt)) {
              while (p_Var7 = p_Var30->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                p_Var31 = (_Hash_node_base *)0x0;
                if (((ulong)p_Var7[1]._M_nxt %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent !=
                     (ulong)p_Var29 %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent) ||
                   (p_Var31 = p_Var30, p_Var30 = p_Var7, p_Var29 == p_Var7[1]._M_nxt))
                goto LAB_007c51e8;
              }
              p_Var31 = (_Hash_node_base *)0x0;
            }
LAB_007c51e8:
            p_Var29 = p_Var57;
            if ((p_Var31 != (_Hash_node_base *)0x0) && (p_Var31->_M_nxt != (_Hash_node_base *)0x0))
            {
              p_Var29 = p_Var32;
            }
          }
          else if (lVar46 == 2) {
LAB_007c512f:
            p_Var29 = p_Var57->_M_nxt;
            p_Var7 = (_Hash_node_base *)
                     ((Type *)((long)local_70 +
                              ((ulong)p_Var29 %
                              (ulong)__begin3.
                                     super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                     .parent) * 8))->id;
            p_Var31 = (_Hash_node_base *)0x0;
            if ((p_Var7 != (_Hash_node_base *)0x0) &&
               (p_Var31 = p_Var7, p_Var30 = p_Var7->_M_nxt, p_Var29 != p_Var7->_M_nxt[1]._M_nxt)) {
              while (p_Var7 = p_Var30->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                p_Var31 = (_Hash_node_base *)0x0;
                if (((ulong)p_Var7[1]._M_nxt %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent !=
                     (ulong)p_Var29 %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent) ||
                   (p_Var31 = p_Var30, p_Var30 = p_Var7, p_Var29 == p_Var7[1]._M_nxt))
                goto LAB_007c5184;
              }
              p_Var31 = (_Hash_node_base *)0x0;
            }
LAB_007c5184:
            p_Var29 = p_Var57;
            if ((p_Var31 != (_Hash_node_base *)0x0) && (p_Var31->_M_nxt != (_Hash_node_base *)0x0))
            {
              p_Var57 = p_Var57 + 1;
              goto LAB_007c5193;
            }
          }
          else {
            p_Var29 = p_Var32;
            if (lVar46 == 3) {
              p_Var29 = p_Var57->_M_nxt;
              p_Var7 = (_Hash_node_base *)
                       ((Type *)((long)local_70 +
                                ((ulong)p_Var29 %
                                (ulong)__begin3.
                                       super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent) * 8))->id;
              p_Var31 = (_Hash_node_base *)0x0;
              if ((p_Var7 != (_Hash_node_base *)0x0) &&
                 (p_Var31 = p_Var7, p_Var30 = p_Var7->_M_nxt, p_Var29 != p_Var7->_M_nxt[1]._M_nxt))
              {
                while (p_Var7 = p_Var30->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
                  p_Var31 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var7[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var29 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var31 = p_Var30, p_Var30 = p_Var7, p_Var29 == p_Var7[1]._M_nxt))
                  goto LAB_007c5118;
                }
                p_Var31 = (_Hash_node_base *)0x0;
              }
LAB_007c5118:
              p_Var29 = p_Var57;
              if ((p_Var31 != (_Hash_node_base *)0x0) && (p_Var31->_M_nxt != (_Hash_node_base *)0x0)
                 ) {
                p_Var57 = p_Var57 + 1;
                goto LAB_007c512f;
              }
            }
          }
LAB_007c51f8:
          p_Var57 = p_Var29 + 1;
          if (p_Var57 != p_Var32 && p_Var29 != p_Var32) {
            do {
              p_Var7 = p_Var57->_M_nxt;
              p_Var31 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var7 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var30 = (_Hash_node_base *)0x0;
              if ((p_Var31 != (_Hash_node_base *)0x0) &&
                 (p_Var60 = p_Var31->_M_nxt, p_Var30 = p_Var31, p_Var7 != p_Var60[1]._M_nxt)) {
                while (p_Var31 = p_Var60->_M_nxt, p_Var31 != (_Hash_node_base *)0x0) {
                  p_Var30 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var31[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var7 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var30 = p_Var60, p_Var60 = p_Var31, p_Var7 == p_Var31[1]._M_nxt))
                  goto LAB_007c5269;
                }
                p_Var30 = (_Hash_node_base *)0x0;
              }
LAB_007c5269:
              if ((p_Var30 != (_Hash_node_base *)0x0) && (p_Var30->_M_nxt != (_Hash_node_base *)0x0)
                 ) {
                p_Var29->_M_nxt = p_Var7;
                p_Var29 = p_Var29 + 1;
              }
              p_Var57 = p_Var57 + 1;
            } while (p_Var57 != p_Var32);
          }
          p_Var32 = *(_Hash_node_base **)
                     ((long)(pBVar59->contents).start.
                            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x68);
          if (p_Var29 != p_Var32) {
            sVar53 = (long)p_Var65[0xd]._M_nxt - (long)p_Var32;
            if (sVar53 != 0) {
              memmove(p_Var29,p_Var32,sVar53);
            }
            p_Var29 = (_Hash_node_base *)
                      ((long)p_Var29 + ((long)p_Var65[0xd]._M_nxt - (long)p_Var32));
            if (p_Var65[0xd]._M_nxt != p_Var29) {
              p_Var65[0xd]._M_nxt = p_Var29;
            }
          }
          lVar46 = (long)(pBVar59->contents).start.
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
          pTVar28 = *(Type **)(lVar46 + 0x48);
          in_R8.id = *(long *)(lVar46 + 0x50);
          lVar61 = (long)(in_R8.id - (long)pTVar28) >> 5;
          pTVar33 = pTVar28;
          if (0 < lVar61) {
            pTVar33 = (Type *)((long)&pTVar28->id + (in_R8.id - (long)pTVar28 & 0xffffffffffffffe0))
            ;
            do {
              p_Var65 = (_Hash_node_base *)pTVar28->id;
              p_Var29 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var65 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var32 = (_Hash_node_base *)0x0;
              if ((p_Var29 != (_Hash_node_base *)0x0) &&
                 (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt
                 )) {
                while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                  p_Var32 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var29[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var65 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                  goto LAB_007c5348;
                }
                p_Var32 = (_Hash_node_base *)0x0;
              }
LAB_007c5348:
              if ((p_Var32 == (_Hash_node_base *)0x0) || (p_Var32->_M_nxt == (_Hash_node_base *)0x0)
                 ) goto LAB_007c5644;
              p_Var65 = (_Hash_node_base *)pTVar28[1].id;
              p_Var29 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var65 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var32 = (_Hash_node_base *)0x0;
              if ((p_Var29 != (_Hash_node_base *)0x0) &&
                 (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt
                 )) {
                while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                  p_Var32 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var29[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var65 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                  goto LAB_007c53b2;
                }
                p_Var32 = (_Hash_node_base *)0x0;
              }
LAB_007c53b2:
              if ((p_Var32 == (_Hash_node_base *)0x0) || (p_Var32->_M_nxt == (_Hash_node_base *)0x0)
                 ) {
                pTVar28 = pTVar28 + 1;
                goto LAB_007c5644;
              }
              p_Var65 = (_Hash_node_base *)pTVar28[2].id;
              p_Var29 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var65 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var32 = (_Hash_node_base *)0x0;
              if ((p_Var29 != (_Hash_node_base *)0x0) &&
                 (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt
                 )) {
                while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                  p_Var32 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var29[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var65 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                  goto LAB_007c541c;
                }
                p_Var32 = (_Hash_node_base *)0x0;
              }
LAB_007c541c:
              if ((p_Var32 == (_Hash_node_base *)0x0) || (p_Var32->_M_nxt == (_Hash_node_base *)0x0)
                 ) {
                pTVar28 = pTVar28 + 2;
                goto LAB_007c5644;
              }
              p_Var65 = (_Hash_node_base *)pTVar28[3].id;
              p_Var29 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var65 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var32 = (_Hash_node_base *)0x0;
              if ((p_Var29 != (_Hash_node_base *)0x0) &&
                 (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt
                 )) {
                while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                  p_Var32 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var29[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var65 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                  goto LAB_007c5486;
                }
                p_Var32 = (_Hash_node_base *)0x0;
              }
LAB_007c5486:
              if ((p_Var32 == (_Hash_node_base *)0x0) || (p_Var32->_M_nxt == (_Hash_node_base *)0x0)
                 ) {
                pTVar28 = pTVar28 + 3;
                goto LAB_007c5644;
              }
              pTVar28 = pTVar28 + 4;
              bVar68 = 1 < lVar61;
              lVar61 = lVar61 + -1;
            } while (bVar68);
          }
          lVar61 = (long)(in_R8.id - (long)pTVar33) >> 3;
          if (lVar61 == 1) {
LAB_007c55d7:
            p_Var65 = (_Hash_node_base *)pTVar33->id;
            p_Var29 = (_Hash_node_base *)
                      ((Type *)((long)local_70 +
                               ((ulong)p_Var65 %
                               (ulong)__begin3.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .parent) * 8))->id;
            p_Var32 = (_Hash_node_base *)0x0;
            if ((p_Var29 != (_Hash_node_base *)0x0) &&
               (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt))
            {
              while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                p_Var32 = (_Hash_node_base *)0x0;
                if (((ulong)p_Var29[1]._M_nxt %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent !=
                     (ulong)p_Var65 %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent) ||
                   (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                goto LAB_007c5634;
              }
              p_Var32 = (_Hash_node_base *)0x0;
            }
LAB_007c5634:
            pTVar28 = pTVar33;
            if ((p_Var32 != (_Hash_node_base *)0x0) && (p_Var32->_M_nxt != (_Hash_node_base *)0x0))
            {
              pTVar28 = (Type *)in_R8.id;
            }
          }
          else if (lVar61 == 2) {
LAB_007c556b:
            p_Var65 = (_Hash_node_base *)pTVar33->id;
            p_Var29 = (_Hash_node_base *)
                      ((Type *)((long)local_70 +
                               ((ulong)p_Var65 %
                               (ulong)__begin3.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .parent) * 8))->id;
            p_Var32 = (_Hash_node_base *)0x0;
            if ((p_Var29 != (_Hash_node_base *)0x0) &&
               (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt))
            {
              while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                p_Var32 = (_Hash_node_base *)0x0;
                if (((ulong)p_Var29[1]._M_nxt %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent !=
                     (ulong)p_Var65 %
                     (ulong)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent) ||
                   (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                goto LAB_007c55c8;
              }
              p_Var32 = (_Hash_node_base *)0x0;
            }
LAB_007c55c8:
            pTVar28 = pTVar33;
            if ((p_Var32 != (_Hash_node_base *)0x0) && (p_Var32->_M_nxt != (_Hash_node_base *)0x0))
            {
              pTVar33 = pTVar33 + 1;
              goto LAB_007c55d7;
            }
          }
          else {
            pTVar28 = (Type *)in_R8.id;
            if (lVar61 == 3) {
              p_Var65 = (_Hash_node_base *)pTVar33->id;
              p_Var29 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var65 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var32 = (_Hash_node_base *)0x0;
              if ((p_Var29 != (_Hash_node_base *)0x0) &&
                 (p_Var32 = p_Var29, p_Var57 = p_Var29->_M_nxt, p_Var65 != p_Var29->_M_nxt[1]._M_nxt
                 )) {
                while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                  p_Var32 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var29[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var65 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                  goto LAB_007c5554;
                }
                p_Var32 = (_Hash_node_base *)0x0;
              }
LAB_007c5554:
              pTVar28 = pTVar33;
              if ((p_Var32 != (_Hash_node_base *)0x0) && (p_Var32->_M_nxt != (_Hash_node_base *)0x0)
                 ) {
                pTVar33 = pTVar33 + 1;
                goto LAB_007c556b;
              }
            }
          }
LAB_007c5644:
          pTVar33 = pTVar28;
          if (pTVar28 != (Type *)in_R8.id) {
            while (pTVar33 = pTVar33 + 1, pTVar33 != (Type *)in_R8.id) {
              p_Var65 = (_Hash_node_base *)pTVar33->id;
              p_Var29 = (_Hash_node_base *)
                        ((Type *)((long)local_70 +
                                 ((ulong)p_Var65 %
                                 (ulong)__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                        .parent) * 8))->id;
              p_Var32 = (_Hash_node_base *)0x0;
              if ((p_Var29 != (_Hash_node_base *)0x0) &&
                 (p_Var57 = p_Var29->_M_nxt, p_Var32 = p_Var29, p_Var65 != p_Var57[1]._M_nxt)) {
                while (p_Var29 = p_Var57->_M_nxt, p_Var29 != (_Hash_node_base *)0x0) {
                  p_Var32 = (_Hash_node_base *)0x0;
                  if (((ulong)p_Var29[1]._M_nxt %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent !=
                       (ulong)p_Var65 %
                       (ulong)__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              parent) ||
                     (p_Var32 = p_Var57, p_Var57 = p_Var29, p_Var65 == p_Var29[1]._M_nxt))
                  goto LAB_007c56b7;
                }
                p_Var32 = (_Hash_node_base *)0x0;
              }
LAB_007c56b7:
              if ((p_Var32 != (_Hash_node_base *)0x0) && (p_Var32->_M_nxt != (_Hash_node_base *)0x0)
                 ) {
                pTVar28->id = (uintptr_t)p_Var65;
                pTVar28 = pTVar28 + 1;
              }
            }
          }
          pTVar33 = *(Type **)((long)(pBVar59->contents).start.
                                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 0x50);
          if (pTVar28 != pTVar33) {
            sVar53 = *(long *)(lVar46 + 0x50) - (long)pTVar33;
            if (sVar53 != 0) {
              memmove(pTVar28,pTVar33,sVar53);
            }
            lVar61 = (long)pTVar28 + (*(long *)(lVar46 + 0x50) - (long)pTVar33);
            if (*(long *)(lVar46 + 0x50) != lVar61) {
              *(long *)(lVar46 + 0x50) = lVar61;
            }
          }
        }
        pBVar59 = (BasicBlock *)
                  &(pBVar59->contents).start.
                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (pBVar59 != (BasicBlock *)local_120);
    }
    puVar66 = (undefined8 *)
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    while (puVar66 != (undefined8 *)0x0) {
      puVar6 = (undefined8 *)*puVar66;
      operator_delete(puVar66,0x10);
      puVar66 = puVar6;
    }
    memset((void *)local_70,0,
           (long)__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
           << 3);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    if ((undefined1  [8])&TStack_40 != local_70) {
      operator_delete((void *)local_70,
                      (long)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent << 3);
    }
    puVar17 = walker.
              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
              .
              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
              .basicBlocks.
              super__Vector_base<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auStack_d8 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
    queue._M_h._M_buckets = (__buckets_ptr)0x1;
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    queue._M_h._M_element_count._0_4_ = 0x3f800000;
    queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    queue._M_h._M_rehash_policy._4_4_ = 0;
    queue._M_h._M_rehash_policy._M_next_resize = 0;
    for (pBVar59 = walker.
                   super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                   .
                   super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                   .exit; pBVar59 != (BasicBlock *)puVar17;
        pBVar59 = (BasicBlock *)
                  &(pBVar59->contents).start.
                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
      __code_00 = (__hash_code)
                  (pBVar59->contents).start.
                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pTVar28 = *(Type **)(walker.
                           super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                           ._560_8_ +
                          (__code_00 %
                          (ulong)walker.
                                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                 .liveBlocks._M_h._M_buckets) * 8);
      pTVar33 = (Type *)0x0;
      if ((pTVar28 != (Type *)0x0) &&
         (in_R8.id = pTVar28->id, pTVar33 = pTVar28, pTVar28 = (Type *)in_R8.id,
         __code_00 != ((Type *)(in_R8.id + 8))->id)) {
        while (in_R8.id = pTVar28->id, (Type *)in_R8.id != (Type *)0x0) {
          pTVar33 = (Type *)0x0;
          if ((((Type *)(in_R8.id + 8))->id %
               (ulong)walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .liveBlocks._M_h._M_buckets !=
               __code_00 %
               (ulong)walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .liveBlocks._M_h._M_buckets) ||
             (pTVar33 = pTVar28, pTVar28 = (Type *)in_R8.id,
             __code_00 == ((Type *)(in_R8.id + 8))->id)) goto LAB_007c5825;
        }
        pTVar33 = (Type *)0x0;
      }
LAB_007c5825:
      if ((pTVar33 != (Type *)0x0) && (pTVar33->id != 0)) {
        __bkt = (SetOfLocals *)(__code_00 % (ulong)queue._M_h._M_buckets);
        pTVar28 = *(Type **)((long)auStack_d8 + (long)__bkt * 8);
        pTVar33 = (Type *)0x0;
        live = __bkt;
        if ((pTVar28 != (Type *)0x0) &&
           (pTVar33 = pTVar28, pTVar8 = (Type *)pTVar28->id,
           __code_00 != ((Type *)pTVar28->id)[1].id)) {
          while (in_R8.id = (uintptr_t)pTVar8, pTVar8 = (Type *)((Type *)in_R8.id)->id,
                pTVar8 != (Type *)0x0) {
            live = (SetOfLocals *)(pTVar8[1].id % (ulong)queue._M_h._M_buckets);
            pTVar33 = (Type *)0x0;
            if ((live != __bkt) || (pTVar33 = (Type *)in_R8.id, __code_00 == pTVar8[1].id))
            goto LAB_007c5898;
          }
          pTVar33 = (Type *)0x0;
        }
LAB_007c5898:
        if ((pTVar33 == (Type *)0x0) || (pTVar33->id == 0)) {
          __node = (__node_ptr)operator_new(0x10);
          (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
          *(__hash_code *)
           (__node->
           super__Hash_node_value<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_false>
           ).
           super__Hash_node_value_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>
           ._M_storage._M_storage.__data = __code_00;
          std::
          _Hashtable<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_insert_unique_node
                    ((_Hashtable<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)auStack_d8,(size_type)__bkt,__code_00,__node,in_R8.id);
          live = extraout_RDX_01;
        }
        actions = (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                  (pBVar59->contents).start.
                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::
        scanLivenessThroughActions
                  ((LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    *)(actions + 2),actions,live);
      }
    }
    puVar66 = (undefined8 *)queue._M_h._M_bucket_count;
    if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      do {
        this_01 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                   (queue._M_h._M_bucket_count + 8);
        std::
        unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ::erase((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 *)auStack_d8,(iterator)queue._M_h._M_bucket_count);
        local_f8._0_8_ = (value_type)0x0;
        local_f8._8_8_ = (BasicBlock *)0x0;
        local_e8 = (pointer)0x0;
        puVar34 = this_01[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start;
        if (this_01[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar34) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8,
                     *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)puVar34);
          puVar34 = this_01[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (8 < (ulong)((long)this_01[3].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar34)) {
            uVar52 = 1;
            uVar64 = 2;
            do {
              SortedVector::merge((SortedVector *)&stack0xfffffffffffffec8,(SortedVector *)local_f8,
                                  *(SortedVector **)(puVar34 + uVar52 * 2));
              puVar34 = local_e8;
              uVar19 = local_f8._0_8_;
              local_f8._0_8_ = TStack_138.id;
              local_f8._8_8_ = curr;
              local_e8 = local_128;
              TStack_138.id = 0;
              curr = (BasicBlock *)0x0;
              local_128 = (pointer)0x0;
              if ((value_type)uVar19 != (value_type)0x0) {
                operator_delete((void *)uVar19,(long)puVar34 - uVar19);
              }
              if ((value_type)TStack_138.id != (value_type)0x0) {
                operator_delete((void *)TStack_138.id,(long)local_128 - TStack_138.id);
              }
              puVar34 = this_01[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              bVar68 = uVar64 < (ulong)((long)this_01[3].
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)puVar34 >> 3);
              uVar52 = uVar64;
              uVar64 = (ulong)((int)uVar64 + 1);
            } while (bVar68);
          }
          puVar34 = this_01[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar9 = this_01[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          uVar64 = (long)puVar9 - (long)puVar34;
          uVar52 = local_f8._8_8_ - local_f8._0_8_;
          if ((uVar64 != uVar52) ||
             ((puVar9 != puVar34 &&
              (iVar21 = bcmp(puVar34,(void *)local_f8._0_8_,uVar64), iVar21 != 0)))) {
            if (uVar52 <= uVar64) {
              __assert_fail("curr->contents.end.size() < live.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                            ,0xf4,
                            "void wasm::LivenessWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::flowLiveness() [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                           );
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (this_01 + 1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
            LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            ::scanLivenessThroughActions
                      ((LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                        *)(this_01 + 2),
                       (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                       local_f8,live_00);
            puVar34 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar9 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            uVar64 = (long)puVar9 - (long)puVar34;
            uVar52 = local_f8._8_8_ - local_f8._0_8_;
            if ((uVar64 != uVar52) ||
               ((puVar9 != puVar34 &&
                (iVar21 = bcmp(puVar34,(void *)local_f8._0_8_,uVar64), iVar21 != 0)))) {
              if (uVar52 <= uVar64) {
                __assert_fail("curr->contents.start.size() < live.size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                              ,0xfc,
                              "void wasm::LivenessWalker<RelevantLiveLocalsWalker, wasm::Visitor<RelevantLiveLocalsWalker>>::flowLiveness() [SubType = RelevantLiveLocalsWalker, VisitorType = wasm::Visitor<RelevantLiveLocalsWalker>]"
                             );
              }
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (this_01,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
              puVar9 = this_01[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              for (puVar34 = this_01[4].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start; puVar34 != puVar9;
                  puVar34 = puVar34 + 2) {
                TStack_138.id = *(uintptr_t *)puVar34;
                std::
                unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ::insert((unordered_set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)auStack_d8,(value_type *)&stack0xfffffffffffffec8);
              }
            }
          }
        }
        if ((value_type)local_f8._0_8_ != (value_type)0x0) {
          operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
        }
        puVar66 = (undefined8 *)queue._M_h._M_bucket_count;
      } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
    }
    while (puVar66 != (undefined8 *)0x0) {
      puVar6 = (undefined8 *)*puVar66;
      operator_delete(puVar66,0x10);
      puVar66 = puVar6;
    }
    memset((void *)auStack_d8,0,(long)queue._M_h._M_buckets << 3);
    pAVar20 = local_38;
    queue._M_h._M_bucket_count = 0;
    queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != auStack_d8) {
      operator_delete((void *)auStack_d8,(long)queue._M_h._M_buckets << 3);
    }
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    flexible.
    super__Vector_base<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task,_std::allocator<wasm::Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    currFunction = (Function *)0x0;
    pAVar62 = pAVar20;
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .liveBlocks._M_h._M_bucket_count != 0) {
      plVar67 = (long *)walker.
                        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                        .liveBlocks._M_h._M_bucket_count;
      do {
        p_Var43 = (_Base_ptr)plVar67[1];
        psVar4 = &walker.relevantBasicBlocks;
        p_Var47 = (_Base_ptr)psVar4;
        for (p_Var51 = (_Base_ptr)
                       walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
            ; p_Var51 != (_Base_ptr)0x0;
            p_Var51 = (&p_Var51->_M_left)[*(_Base_ptr *)(p_Var51 + 1) < p_Var43]) {
          if (*(_Base_ptr *)(p_Var51 + 1) >= p_Var43) {
            p_Var47 = p_Var51;
          }
        }
        psVar54 = psVar4;
        if ((p_Var47 != (_Base_ptr)psVar4) &&
           (psVar54 = (set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                       *)p_Var47,
           p_Var43 < (((set<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::less<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                        *)p_Var47)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
          psVar54 = psVar4;
        }
        if (psVar54 != psVar4) {
          p_Var51 = p_Var43->_M_parent;
          for (p_Var43 = *(_Base_ptr *)p_Var43; p_Var43 != p_Var51;
              p_Var43 = (_Base_ptr)&p_Var43->field_0x4) {
            auStack_d8._0_4_ = p_Var43->_M_color;
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&pAVar20->relevantLiveLocals,(uint *)auStack_d8);
          }
        }
        plVar67 = (long *)*plVar67;
        pAVar62 = local_38;
      } while (plVar67 != (long *)0x0);
    }
    ::anon_func::RelevantLiveLocalsWalker::~RelevantLiveLocalsWalker
              ((RelevantLiveLocalsWalker *)auStack_498);
    pFVar12 = local_100;
    IVar22 = Builder::addVar((Builder *)local_100,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
    IVar23 = Builder::addVar((Builder *)pFVar12,(Function *)0x0,(Name)(ZEXT816(2) << 0x40),in_R8);
    pAVar62->rewindIndex = IVar23;
    BVar10.wasm = (pAVar62->
                  super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                  ).
                  super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                  .
                  super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                  .currModule;
    pAVar35 = (AsyncifyBuilder *)operator_new(0x28);
    pcVar50 = (pAVar62->asyncifyMemory).super_IString.str._M_str;
    (pAVar35->super_Builder).wasm = BVar10.wasm;
    pAVar35->wasm = BVar10.wasm;
    sVar27 = (pAVar62->asyncifyMemory).super_IString.str._M_len;
    (pAVar35->pointerType).id = (pAVar62->pointerType).id;
    (pAVar35->asyncifyMemory).super_IString.str._M_len = sVar27;
    (pAVar35->asyncifyMemory).super_IString.str._M_str = pcVar50;
    pAVar11 = (pAVar62->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    (pAVar62->builder)._M_t.
    super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
    .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>._M_head_impl =
         pAVar35;
    if (pAVar11 != (AsyncifyBuilder *)0x0) {
      operator_delete(pAVar11,0x28);
    }
    Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
    ::walk(&(pAVar62->
            super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
            ).
            super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
            .
            super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
           ,(Expression **)currp);
    this_00 = &local_100->type;
    SVar69 = HeapType::getSignature(this_00);
    pMVar58 = &((((pAVar62->builder)._M_t.
                  super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                  .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                 _M_head_impl)->super_Builder).wasm)->allocator;
    if (SVar69.results.id.id == 0) {
      local_140 = (Expression *)MixedArena::allocSpace(pMVar58,0x18,8);
      local_140->_id = ReturnId;
      (local_140->type).id = 0;
      *(undefined8 *)(local_140 + 1) = 0;
      (local_140->type).id = 1;
      *(undefined8 *)(local_140 + 1) = 0;
    }
    else {
      local_140 = (Expression *)MixedArena::allocSpace(pMVar58,0x10,8);
      local_140->_id = UnreachableId;
      (local_140->type).id = 1;
    }
    local_120 = &pAVar62->asyncifyMemory;
    pAVar11 = (pAVar62->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    pEVar36 = AsyncifyBuilder::makeStateCheck(pAVar11,Rewinding);
    walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
    if ((pAVar62->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pBVar37 = (Block *)MixedArena::allocSpace
                                   (&((((pAVar62->builder)._M_t.
                                        super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        .
                                        super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                       ._M_head_impl)->super_Builder).wasm)->allocator,0x10,8);
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
    }
    else {
      pFVar12 = (pAVar62->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .currFunction;
      local_110 = (Store *)Function::getNumLocals(pFVar12);
      if (local_110 == (Store *)0x0) {
        iVar21 = 0;
      }
      else {
        p_Var49 = &(pAVar62->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header;
        iVar21 = 0;
        TVar45.id = 0;
        do {
          uVar25 = (uint)TVar45.id;
          p_Var51 = (pAVar62->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          p_Var43 = &p_Var49->_M_header;
          for (; (_Rb_tree_header *)p_Var51 != (_Rb_tree_header *)0x0;
              p_Var51 = (&p_Var51->_M_left)[bVar68]) {
            bVar68 = (uint)*(size_t *)(p_Var51 + 1) < uVar25;
            if (!bVar68) {
              p_Var43 = p_Var51;
            }
          }
          p_Var48 = p_Var49;
          if (((_Rb_tree_header *)p_Var43 != p_Var49) &&
             (p_Var48 = (_Rb_tree_header *)p_Var43,
             uVar25 < (uint)((_Rb_tree_header *)p_Var43)->_M_node_count)) {
            p_Var48 = p_Var49;
          }
          if (p_Var48 != p_Var49) {
            this_02 = Function::getLocalType(pFVar12,uVar25);
            uVar24 = getByteSize((AsyncifyLocals *)this_02.id,TVar45);
            iVar21 = iVar21 + uVar24;
          }
          TVar45.id = (uintptr_t)(uVar25 + 1);
        } while (TVar45.id < local_110);
      }
      pMVar58 = &((((pAVar62->builder)._M_t.
                    super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                   _M_head_impl)->super_Builder).wasm)->allocator;
      pBVar37 = (Block *)MixedArena::allocSpace(pMVar58,0x40,8);
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (pBVar37->name).super_IString.str._M_len = 0;
      (pBVar37->name).super_IString.str._M_str = (char *)0x0;
      (pBVar37->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar37->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (pBVar37->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (pBVar37->list).allocator = pMVar58;
      pEVar1 = &pBVar37->list;
      pEVar38 = AsyncifyBuilder::makeIncStackPos
                          ((pAVar62->builder)._M_t.
                           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           .
                           super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                           ._M_head_impl,-iVar21);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,pEVar38);
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (((pAVar62->builder)._M_t.
             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
            _M_head_impl)->pointerType).id;
      IVar23 = Builder::addVar((Builder *)pFVar12,(Function *)0x0,(Name)(auVar14 << 0x40),in_R8);
      pAVar35 = (pAVar62->builder)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                _M_head_impl;
      pEVar38 = AsyncifyBuilder::makeGetStackPos(pAVar35);
      pLVar39 = Builder::makeLocalSet(&pAVar35->super_Builder,IVar23,pEVar38);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pLVar39);
      if (local_110 != (Store *)0x0) {
        pLVar39 = (LocalSet *)&(pAVar62->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header;
        local_88 = (pointer)0x0;
        pSVar42 = (Store *)0x0;
        do {
          uVar25 = (uint)pSVar42;
          p_Var43 = (_Base_ptr)pLVar39;
          for (p_Var51 = (pAVar62->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_parent; (_Rb_tree_header *)p_Var51 != (_Rb_tree_header *)0x0;
              p_Var51 = (&p_Var51->_M_left)[bVar68]) {
            bVar68 = (uint)*(size_t *)(p_Var51 + 1) < uVar25;
            if (!bVar68) {
              p_Var43 = p_Var51;
            }
          }
          p_Var49 = (_Rb_tree_header *)pLVar39;
          if ((p_Var43 != (_Base_ptr)pLVar39) &&
             (p_Var49 = (_Rb_tree_header *)p_Var43,
             uVar25 < (uint)((_Rb_tree_header *)p_Var43)->_M_node_count)) {
            p_Var49 = (_Rb_tree_header *)pLVar39;
          }
          if (p_Var49 != (_Rb_tree_header *)pLVar39) {
            TVar45.id = (uintptr_t)pSVar42;
            TStack_138 = Function::getLocalType(pFVar12,uVar25);
            auStack_498 = (undefined1  [8])0x0;
            walker.
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .
            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
            stack.fixed._M_elems[0].currp = (Expression **)0x0;
            walker.
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .
            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
            stack.usedFixed = 0;
            walker.
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .
            super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            .super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
            stack.fixed._M_elems[0].func = (TaskFunc)0x0;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            local_70 = (undefined1  [8])&stack0xfffffffffffffec8;
            local_118 = (Type *)wasm::Type::size(&stack0xfffffffffffffec8);
            bVar68 = local_70 != (undefined1  [8])&stack0xfffffffffffffec8;
            local_108 = pSVar42;
            if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                == local_118) goto LAB_007c60ff;
            do {
              do {
                pTVar28 = wasm::Type::Iterator::operator*((Iterator *)local_70);
                uVar25 = getByteSize((AsyncifyLocals *)pTVar28->id,TVar45);
                if ((uVar25 & 3) != 0) {
                  __assert_fail("size % STACK_ALIGN == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp"
                                ,0x5e9,
                                "Expression *wasm::(anonymous namespace)::AsyncifyLocals::makeLocalLoading()"
                               );
                }
                pAVar35 = (pAVar62->builder)._M_t.
                          super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                          .
                          super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                          ._M_head_impl;
                uVar13 = (pAVar35->pointerType).id;
                pLVar40 = (pointer)MixedArena::allocSpace
                                             (&((pAVar35->super_Builder).wasm)->allocator,0x18,8);
                *(Id *)&pLVar40->what = LocalGetId;
                *(Index *)&pLVar40->effective = IVar23;
                ((Type *)&pLVar40->origin)->id = uVar13;
                uVar13 = pTVar28->id;
                auStack_d8 = (undefined1  [8])(local_120->super_IString).str._M_len;
                queue._M_h._M_buckets = (__buckets_ptr)(local_120->super_IString).str._M_str;
                pBVar41 = (value_type)
                          MixedArena::allocSpace(&((pAVar35->super_Builder).wasm)->allocator,0x48,8)
                ;
                *(Id *)&(pBVar41->contents).start.
                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start = LoadId;
                (pBVar41->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (pBVar41->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                *(undefined1 *)
                 &(pBVar41->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = 0;
                *(char *)&(pBVar41->contents).start.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (char)uVar25;
                *(undefined1 *)
                 ((long)&(pBVar41->contents).start.
                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 1) = 1;
                (pBVar41->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start = local_88;
                (pBVar41->contents).end.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x4;
                (pBVar41->contents).actions.
                super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>.
                _M_impl.super__Vector_impl_data._M_start = pLVar40;
                ((Type *)&(pBVar41->contents).start.
                          super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish)->id = uVar13;
                (((Name *)&(pBVar41->contents).actions.
                           super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->super_IString).str._M_len =
                     (size_t)auStack_d8;
                (pBVar41->contents).actions.
                super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)queue._M_h._M_buckets;
                Load::finalize((Load *)pBVar41);
                TVar45.id = (uintptr_t)local_f8;
                local_f8._0_8_ = pBVar41;
                SmallVector<wasm::Expression_*,_1UL>::push_back
                          ((SmallVector<wasm::Expression_*,_1UL> *)auStack_498,
                           (Expression **)TVar45.id);
                local_88 = (pointer)(ulong)((int)local_88 + uVar25);
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1);
                bVar68 = local_70 != (undefined1  [8])&stack0xfffffffffffffec8;
                pAVar62 = local_38;
              } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       parent != local_118);
LAB_007c60ff:
            } while (bVar68);
            value = (TupleMake *)
                    walker.
                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .
                    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                    .
                    super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .
                    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    .replacep;
            pSVar42 = local_108;
            if ((long)((((LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                          *)auStack_498)->
                       super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                       ).
                       super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .
                       super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .stack.fixed._M_elems + -1) +
                ((long)((long)walker.
                              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                              .
                              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                              .
                              super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                              .
                              super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                              .stack.fixed._M_elems[0].func -
                       walker.
                       super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .
                       super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                       .
                       super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .
                       super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                       .stack.usedFixed) >> 3) != 1) {
              sVar27 = wasm::Type::size(&stack0xfffffffffffffec8);
              pSVar42 = local_108;
              if (sVar27 < 2) {
                handle_unreachable("Unexpected empty type",
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp"
                                   ,0x5fb);
              }
              value = Builder::makeTupleMake<wasm::SmallVector<wasm::Expression*,1ul>>
                                (&((pAVar62->builder)._M_t.
                                   super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                   .
                                   super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                  ._M_head_impl)->super_Builder,
                                 (SmallVector<wasm::Expression_*,_1UL> *)auStack_498);
            }
            item = Builder::makeLocalSet
                             (&((pAVar62->builder)._M_t.
                                super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                .
                                super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                               ._M_head_impl)->super_Builder,(Index)pSVar42,(Expression *)value);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&pEVar1->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       (Expression *)item);
            if (walker.
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                .
                super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .
                super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .stack.usedFixed != 0) {
              operator_delete((void *)walker.
                                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                      .
                                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                                      .
                                      super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                      .
                                      super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                      .stack.usedFixed,
                              (long)walker.
                                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                    .
                                    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                                    .
                                    super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                    .
                                    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                                    .stack.fixed._M_elems[0].currp -
                              walker.
                              super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                              .
                              super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                              .
                              super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                              .
                              super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                              .stack.usedFixed);
            }
          }
          pSVar42 = (Store *)(ulong)((int)pSVar42 + 1);
        } while (pSVar42 < local_110);
      }
      pcVar50 = (char *)0x0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pLVar39;
      Block::finalize(pBVar37,type_,Unknown);
    }
    uVar52 = 0x28;
    this_03 = (key_type)MixedArena::allocSpace(&((pAVar11->super_Builder).wasm)->allocator,0x28,8);
    *(Id *)&(this_03->super_Importable).super_Named.name.super_IString.str._M_len = IfId;
    ((Type *)&(this_03->super_Importable).super_Named.name.super_IString.str._M_str)->id = 0;
    (this_03->super_Importable).module.super_IString.str._M_str = (char *)0x0;
    *(Expression **)&(this_03->super_Importable).super_Named.hasExplicitName = pEVar36;
    (this_03->super_Importable).module.super_IString.str._M_len = (size_t)pBVar37;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar52;
    If::finalize((If *)this_03,type__00);
    pcVar16 = DAT_010d1c38;
    sVar27 = wasm::(anonymous_namespace)::ASYNCIFY_UNWIND;
    pAVar35 = (pAVar62->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pcVar50;
    auStack_498 = (undefined1  [8])this_03;
    pBVar37 = Builder::makeSequence
                        (&pAVar35->super_Builder,
                         (Expression *)
                         (currp->
                         super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                         )._M_impl.super__Vector_impl_data._M_start,local_140,type_00);
    this_04 = Builder::makeBlock(&pAVar35->super_Builder,(Expression *)pBVar37);
    (this_04->name).super_IString.str._M_len = sVar27;
    (this_04->name).super_IString.str._M_str = pcVar16;
    uVar52 = 0;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pBVar37;
    Block::finalize(this_04,type__01,Unknown);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.replacep
         = (Expression **)
           Builder::makeLocalSet(&pAVar35->super_Builder,IVar22,(Expression *)this_04);
    pAVar35 = (pAVar62->builder)._M_t.
              super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              ._M_t.
              super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
              .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
              _M_head_impl;
    pEVar36 = AsyncifyBuilder::makeGetStackPos(pAVar35);
    pEVar38 = (Expression *)
              MixedArena::allocSpace
                        (&((((pAVar62->builder)._M_t.
                             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                             .
                             super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                            ._M_head_impl)->super_Builder).wasm)->allocator,0x18,8);
    pEVar38->_id = LocalGetId;
    *(Index *)(pEVar38 + 1) = IVar22;
    (pEVar38->type).id = 2;
    auStack_d8 = (undefined1  [8])(local_120->super_IString).str._M_len;
    queue._M_h._M_buckets = (__buckets_ptr)(local_120->super_IString).str._M_str;
    pSVar42 = (Store *)MixedArena::allocSpace(&((pAVar35->super_Builder).wasm)->allocator,0x58,8);
    pAVar20 = local_38;
    *(undefined8 *)&(pSVar42->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression =
         0;
    (pSVar42->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar42->align).addr = 0;
    *(undefined8 *)&pSVar42->isAtomic = 0;
    *(undefined8 *)&pSVar42->bytes = 0;
    (pSVar42->offset).addr = 0;
    pSVar42->ptr = (Expression *)0x0;
    pSVar42->value = (Expression *)0x0;
    (pSVar42->valueType).id = 0;
    (pSVar42->memory).super_IString.str._M_len = 0;
    (pSVar42->memory).super_IString.str._M_str = (char *)0x0;
    (pSVar42->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
    (pSVar42->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
    (pSVar42->offset).addr = 0;
    (pSVar42->align).addr = 0;
    pSVar42->isAtomic = false;
    pSVar42->bytes = '\x04';
    (pSVar42->offset).addr = 0;
    (pSVar42->align).addr = 4;
    pSVar42->ptr = pEVar36;
    pSVar42->value = pEVar38;
    (pSVar42->valueType).id = 2;
    (pSVar42->memory).super_IString.str._M_len = (size_t)auStack_d8;
    (pSVar42->memory).super_IString.str._M_str = (char *)queue._M_h._M_buckets;
    Store::finalize(pSVar42);
    pEVar36 = AsyncifyBuilder::makeIncStackPos
                        ((pAVar20->builder)._M_t.
                         super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                         .
                         super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                         ._M_head_impl,4);
    TVar45.id = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar52;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    usedFixed = (size_t)Builder::makeSequence
                                  (&pAVar35->super_Builder,(Expression *)pSVar42,pEVar36,type_01);
    pAVar62 = local_38;
    local_88._0_4_ = 0;
    if ((pAVar20->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      pBVar37 = (Block *)MixedArena::allocSpace
                                   (&((((local_38->builder)._M_t.
                                        super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                        .
                                        super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                       ._M_head_impl)->super_Builder).wasm)->allocator,0x10,8);
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = NopId;
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      uVar52 = extraout_RDX_03;
    }
    else {
      pFVar12 = (local_38->
                super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                ).
                super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .
                super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                .currFunction;
      pSVar42 = (Store *)Function::getNumLocals(pFVar12);
      pMVar58 = &((((pAVar62->builder)._M_t.
                    super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                    .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                   _M_head_impl)->super_Builder).wasm)->allocator;
      pBVar37 = (Block *)MixedArena::allocSpace(pMVar58,0x40,8);
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (pBVar37->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (pBVar37->name).super_IString.str._M_len = 0;
      (pBVar37->name).super_IString.str._M_str = (char *)0x0;
      (pBVar37->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (pBVar37->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (pBVar37->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (pBVar37->list).allocator = pMVar58;
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           (((pAVar62->builder)._M_t.
             super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
             .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
            _M_head_impl)->pointerType).id;
      IVar22 = Builder::addVar((Builder *)pFVar12,(Function *)0x0,(Name)(auVar15 << 0x40),TVar45);
      pEVar1 = &pBVar37->list;
      pAVar35 = (pAVar62->builder)._M_t.
                super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                .super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>.
                _M_head_impl;
      pEVar36 = AsyncifyBuilder::makeGetStackPos(pAVar35);
      pLVar39 = Builder::makeLocalSet(&pAVar35->super_Builder,IVar22,pEVar36);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,(Expression *)pLVar39);
      if (pSVar42 != (Store *)0x0) {
        p_Var49 = &(local_38->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header;
        local_88 = (pointer)0x0;
        TVar45.id = 0;
        do {
          index = (_Rb_tree_color)TVar45.id;
          p_Var51 = (local_38->relevantLiveLocals)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          p_Var43 = &p_Var49->_M_header;
          for (; p_Var51 != (_Base_ptr)0x0; p_Var51 = (&p_Var51->_M_left)[bVar68]) {
            bVar68 = p_Var51[1]._M_color < index;
            if (!bVar68) {
              p_Var43 = p_Var51;
            }
          }
          p_Var51 = &p_Var49->_M_header;
          if (((_Rb_tree_header *)p_Var43 != p_Var49) &&
             (p_Var51 = p_Var43, index < p_Var43[1]._M_color)) {
            p_Var51 = &p_Var49->_M_header;
          }
          pSVar56 = (Store *)TVar45.id;
          if ((_Rb_tree_header *)p_Var51 != p_Var49) {
            local_108 = (Store *)TVar45.id;
            TStack_138 = Function::getLocalType(pFVar12,index);
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            local_70 = (undefined1  [8])&stack0xfffffffffffffec8;
            pTVar28 = (Type *)wasm::Type::size(&stack0xfffffffffffffec8);
            if ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 != pTVar28) ||
               (pSVar56 = local_108, local_70 != (undefined1  [8])&stack0xfffffffffffffec8)) {
              IVar23 = 0;
              do {
                local_118 = wasm::Type::Iterator::operator*((Iterator *)local_70);
                uVar25 = getByteSize((AsyncifyLocals *)local_118->id,TVar45);
                TVar45.id = TStack_138.id;
                pTVar44 = (TupleExtract *)
                          MixedArena::allocSpace
                                    (&((((local_38->builder)._M_t.
                                         super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                         .
                                         super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                        ._M_head_impl)->super_Builder).wasm)->allocator,0x18,8);
                (pTVar44->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id =
                     LocalGetId;
                *(int *)&pTVar44->tuple = (int)local_108;
                (pTVar44->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.type.
                id = TVar45.id;
                sVar27 = wasm::Type::size(&stack0xfffffffffffffec8);
                this_05 = pTVar44;
                if (1 < sVar27) {
                  this_05 = (TupleExtract *)
                            MixedArena::allocSpace
                                      (&((((local_38->builder)._M_t.
                                           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                                           .
                                           super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                                          ._M_head_impl)->super_Builder).wasm)->allocator,0x20,8);
                  (this_05->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression._id
                       = TupleExtractId;
                  (this_05->super_SpecificExpression<(wasm::Expression::Id)58>).super_Expression.
                  type.id = 0;
                  this_05->tuple = (Expression *)pTVar44;
                  this_05->index = IVar23;
                  TupleExtract::finalize(this_05);
                }
                if ((uVar25 & 3) != 0) {
                  __assert_fail("size % STACK_ALIGN == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Asyncify.cpp"
                                ,0x61a,
                                "Expression *wasm::(anonymous namespace)::AsyncifyLocals::makeLocalSaving()"
                               );
                }
                pAVar35 = (local_38->builder)._M_t.
                          super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                          .
                          super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                          ._M_head_impl;
                local_110 = (Store *)(pAVar35->pointerType).id;
                pEVar36 = (Expression *)
                          MixedArena::allocSpace(&((pAVar35->super_Builder).wasm)->allocator,0x18,8)
                ;
                pEVar36->_id = LocalGetId;
                *(Index *)(pEVar36 + 1) = IVar22;
                (pEVar36->type).id = (uintptr_t)local_110;
                local_118 = (Type *)local_118->id;
                auStack_d8 = (undefined1  [8])(local_120->super_IString).str._M_len;
                queue._M_h._M_buckets = (__buckets_ptr)(local_120->super_IString).str._M_str;
                TVar45.id = (uintptr_t)
                            MixedArena::allocSpace
                                      (&((pAVar35->super_Builder).wasm)->allocator,0x58,8);
                *(undefined8 *)
                 &(((Store *)TVar45.id)->super_SpecificExpression<(wasm::Expression::Id)13>).
                  super_Expression = 0;
                (((Store *)TVar45.id)->super_SpecificExpression<(wasm::Expression::Id)13>).
                super_Expression.type.id = 0;
                (((Store *)TVar45.id)->align).addr = 0;
                *(undefined8 *)&((Store *)TVar45.id)->isAtomic = 0;
                *(undefined8 *)&((Store *)TVar45.id)->bytes = 0;
                (((Store *)TVar45.id)->offset).addr = 0;
                ((Store *)TVar45.id)->ptr = (Expression *)0x0;
                ((Store *)TVar45.id)->value = (Expression *)0x0;
                (((Store *)TVar45.id)->valueType).id = 0;
                (((Store *)TVar45.id)->memory).super_IString.str._M_len = 0;
                (((Store *)TVar45.id)->memory).super_IString.str._M_str = (char *)0x0;
                (((Store *)TVar45.id)->super_SpecificExpression<(wasm::Expression::Id)13>).
                super_Expression._id = StoreId;
                (((Store *)TVar45.id)->super_SpecificExpression<(wasm::Expression::Id)13>).
                super_Expression.type.id = 0;
                (((Store *)TVar45.id)->offset).addr = 0;
                (((Store *)TVar45.id)->align).addr = 0;
                ((Store *)TVar45.id)->isAtomic = false;
                ((Store *)TVar45.id)->bytes = (uint8_t)uVar25;
                (((Store *)TVar45.id)->offset).addr = (address64_t)local_88;
                (((Store *)TVar45.id)->align).addr = 4;
                ((Store *)TVar45.id)->ptr = pEVar36;
                ((Store *)TVar45.id)->value = (Expression *)this_05;
                (((Store *)TVar45.id)->valueType).id = (uintptr_t)local_118;
                (((Store *)TVar45.id)->memory).super_IString.str._M_len = (size_t)auStack_d8;
                (((Store *)TVar45.id)->memory).super_IString.str._M_str =
                     (char *)queue._M_h._M_buckets;
                Store::finalize((Store *)TVar45.id);
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          (&pEVar1->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(Expression *)TVar45.id);
                local_88 = (pointer)(ulong)((int)local_88 + uVar25);
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1);
                IVar23 = IVar23 + 1;
              } while ((__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .parent != pTVar28) ||
                      (pSVar56 = local_108, local_70 != (undefined1  [8])&stack0xfffffffffffffec8));
            }
          }
          TVar45.id = (uintptr_t)((int)pSVar56 + 1);
        } while (TVar45.id < pSVar42);
      }
      pEVar36 = AsyncifyBuilder::makeIncStackPos
                          ((local_38->builder)._M_t.
                           super___uniq_ptr_impl<wasm::(anonymous_namespace)::AsyncifyBuilder,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyBuilder>_>
                           .
                           super__Head_base<0UL,_wasm::(anonymous_namespace)::AsyncifyBuilder_*,_false>
                           ._M_head_impl,(int)local_88);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&pEVar1->super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                 ,pEVar36);
      type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__02.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar36;
      Block::finalize(pBVar37,type__02,Unknown);
      uVar52 = extraout_RDX_02;
    }
    auStack_d8 = (undefined1  [8])auStack_498;
    queue._M_h._M_buckets = (__buckets_ptr)0x4;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar52;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.stack.
    fixed._M_elems[0].func = (TaskFunc)pBVar37;
    pBVar37 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                        (&pAVar11->super_Builder,(initializer_list<wasm::Expression_*> *)auStack_d8,
                         type);
    sVar27 = walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count;
    SVar69 = HeapType::getSignature
                       ((HeapType *)
                        walker.relevantBasicBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    if (SVar69.results.id.id != 0) {
      SVar69 = HeapType::getSignature((HeapType *)sVar27);
      pEVar36 = LiteralUtils::makeZero
                          (SVar69.results.id,
                           (local_38->
                           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
                           ).
                           super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                           .
                           super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
                           .currModule);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar37->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar36
                );
      SVar69 = HeapType::getSignature((HeapType *)sVar27);
      type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 1;
      type__03.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)SVar69.results.id;
      Block::finalize(pBVar37,type__03,Unknown);
    }
    pFVar12 = local_100;
    (((vector<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
       *)&local_100->body)->
    super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar37;
    ReFinalize::ReFinalize((ReFinalize *)auStack_498);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .branches._M_t._M_impl._0_8_ =
         (local_38->
         super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>_>
         ).
         super_PostWalker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::AsyncifyLocals,_wasm::Visitor<wasm::(anonymous_namespace)::AsyncifyLocals,_void>_>
         .currModule;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .currBasicBlock = (BasicBlock *)pFVar12;
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               (walker.
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                .
                super_PostWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .
                super_Walker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                .stack.fixed._M_elems + 4),(Expression **)currp);
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .currBasicBlock = (BasicBlock *)0x0;
    walker.
    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>.
    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
    .branches._M_t._M_impl._0_8_ = 0;
    auStack_498 = (undefined1  [8])&PTR__ReFinalize_01090960;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                      .branches._M_t._M_impl.super__Rb_tree_header);
    if (walker.
        super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
        .
        super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
        .loopTops.
        super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(walker.
                      super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                      .
                      super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                      .loopTops.
                      super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)walker.
                            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .
                            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                            .loopTops.
                            super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)walker.
                            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                            .
                            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                            .loopTops.
                            super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    Pass::~Pass((Pass *)auStack_498);
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    // If the function cannot change our state, we have nothing to do -
    // we will never unwind or rewind the stack here.
    if (!analyzer->needsInstrumentation(func)) {
      return;
    }
    // Find the locals that we actually need to load and save: any local that is
    // alive at a relevant call site must be handled, but others can be ignored.
    findRelevantLiveLocals(func);
    // The new function body has a prelude to load locals if rewinding,
    // then the actual main body, which does all its unwindings by breaking
    // to the unwind block, which then handles pushing the call index, as
    // well as saving the locals.
    // An index is needed for getting the unwinding and rewinding call indexes
    // around TODO: can this be the same index?
    auto unwindIndex = builder->addVar(func, Type::i32);
    rewindIndex = builder->addVar(func, Type::i32);
    // Rewrite the function body.
    builder = std::make_unique<AsyncifyBuilder>(
      *getModule(), pointerType, asyncifyMemory);
    walk(func->body);
    // After the normal function body, emit a barrier before the postamble.
    Expression* barrier;
    if (func->getResults() == Type::none) {
      // The function may have ended without a return; ensure one.
      barrier = builder->makeReturn();
    } else {
      // The function must have returned or hit an unreachable, but emit one
      // to make possible bugs easier to figure out (as this should never be
      // reached). The optimizer can remove this anyhow.
      barrier = builder->makeUnreachable();
    }
    auto* newBody = builder->makeBlock(
      {builder->makeIf(builder->makeStateCheck(State::Rewinding),
                       makeLocalLoading()),
       builder->makeLocalSet(
         unwindIndex,
         builder->makeBlock(ASYNCIFY_UNWIND,
                            builder->makeSequence(func->body, barrier))),
       makeCallIndexPush(unwindIndex),
       makeLocalSaving()});
    if (func->getResults() != Type::none) {
      // If we unwind, we must still "return" a value, even if it will be
      // ignored on the outside.
      newBody->list.push_back(
        LiteralUtils::makeZero(func->getResults(), *getModule()));
      newBody->finalize(func->getResults());
    }
    func->body = newBody;
    // Making things like returns conditional may alter types.
    ReFinalize().walkFunctionInModule(func, getModule());
  }